

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall cmComputeTargetDepends::ComputeIntermediateGraph(cmComputeTargetDepends *this)

{
  cmValue this_00;
  bool bVar1;
  TargetType TVar2;
  size_type sVar3;
  reference inputEdges;
  reference outputEdges;
  reference ppcVar4;
  allocator<char> local_59;
  string local_58;
  cmValue local_38;
  cmValue optimizeDependencies;
  cmGeneratorTarget *gt;
  value_type *intermediateEdges;
  value_type *initialEdges;
  int i;
  int n;
  cmComputeTargetDepends *this_local;
  
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&(this->IntermediateGraph).
              super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,0);
  sVar3 = std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::size
                    (&(this->InitialGraph).
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&(this->IntermediateGraph).
              super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,sVar3);
  sVar3 = std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::size
                    (&(this->InitialGraph).
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
  for (initialEdges._0_4_ = 0; (int)initialEdges < (int)sVar3;
      initialEdges._0_4_ = (int)initialEdges + 1) {
    inputEdges = std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                           (&(this->InitialGraph).
                             super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                            (long)(int)initialEdges);
    outputEdges = std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                            (&(this->IntermediateGraph).
                              super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                             (long)(int)initialEdges);
    ppcVar4 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
              operator[](&this->Targets,(long)(int)initialEdges);
    optimizeDependencies.Value = (string *)*ppcVar4;
    TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)optimizeDependencies.Value);
    if ((TVar2 == STATIC_LIBRARY) ||
       (TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)optimizeDependencies.Value),
       TVar2 == OBJECT_LIBRARY)) {
      this_00.Value = optimizeDependencies.Value;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"OPTIMIZE_DEPENDENCIES",&local_59);
      local_38 = cmGeneratorTarget::GetProperty(this_00.Value,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator(&local_59);
      bVar1 = cmValue::operator_cast_to_bool(&local_38);
      if (bVar1) {
        bVar1 = cmIsOn(local_38);
        if (bVar1) {
          OptimizeLinkDependencies
                    (this,(cmGeneratorTarget *)optimizeDependencies.Value,outputEdges,inputEdges);
        }
        else {
          cmGraphEdgeList::operator=(outputEdges,inputEdges);
        }
      }
      else {
        cmGraphEdgeList::operator=(outputEdges,inputEdges);
      }
    }
    else {
      cmGraphEdgeList::operator=(outputEdges,inputEdges);
    }
  }
  return;
}

Assistant:

void cmComputeTargetDepends::ComputeIntermediateGraph()
{
  this->IntermediateGraph.resize(0);
  this->IntermediateGraph.resize(this->InitialGraph.size());

  int n = static_cast<int>(this->InitialGraph.size());
  for (int i = 0; i < n; ++i) {
    auto const& initialEdges = this->InitialGraph[i];
    auto& intermediateEdges = this->IntermediateGraph[i];
    cmGeneratorTarget const* gt = this->Targets[i];
    if (gt->GetType() != cmStateEnums::STATIC_LIBRARY &&
        gt->GetType() != cmStateEnums::OBJECT_LIBRARY) {
      intermediateEdges = initialEdges;
    } else {
      if (cmValue optimizeDependencies =
            gt->GetProperty("OPTIMIZE_DEPENDENCIES")) {
        if (cmIsOn(optimizeDependencies)) {
          this->OptimizeLinkDependencies(gt, intermediateEdges, initialEdges);
        } else {
          intermediateEdges = initialEdges;
        }
      } else {
        intermediateEdges = initialEdges;
      }
    }
  }
}